

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall
capnp::compiler::NodeTranslator::compileDefaultDefaultValue
          (NodeTranslator *this,Reader type,Builder target)

{
  Which WVar1;
  Builder local_b0;
  Builder local_98;
  Builder local_80;
  Orphan<capnp::Data> local_68;
  Orphan<capnp::Text> local_38;
  NodeTranslator *local_10;
  NodeTranslator *this_local;
  
  local_10 = this;
  WVar1 = capnp::schema::Type::Reader::which(&type);
  switch(WVar1) {
  case VOID:
    capnp::schema::Value::Builder::setVoid(&target);
    break;
  case BOOL:
    capnp::schema::Value::Builder::setBool(&target,false);
    break;
  case INT8:
    capnp::schema::Value::Builder::setInt8(&target,'\0');
    break;
  case INT16:
    capnp::schema::Value::Builder::setInt16(&target,0);
    break;
  case INT32:
    capnp::schema::Value::Builder::setInt32(&target,0);
    break;
  case INT64:
    capnp::schema::Value::Builder::setInt64(&target,0);
    break;
  case UINT8:
    capnp::schema::Value::Builder::setUint8(&target,'\0');
    break;
  case UINT16:
    capnp::schema::Value::Builder::setUint16(&target,0);
    break;
  case UINT32:
    capnp::schema::Value::Builder::setUint32(&target,0);
    break;
  case UINT64:
    capnp::schema::Value::Builder::setUint64(&target,0);
    break;
  case FLOAT32:
    capnp::schema::Value::Builder::setFloat32(&target,0.0);
    break;
  case FLOAT64:
    capnp::schema::Value::Builder::setFloat64(&target,0.0);
    break;
  case TEXT:
    local_38.builder.capTable = (CapTableBuilder *)0x0;
    local_38.builder.location = (word *)0x0;
    local_38.builder.tag.content = 0;
    local_38.builder.segment = (SegmentBuilder *)0x0;
    Orphan<capnp::Text>::Orphan(&local_38);
    capnp::schema::Value::Builder::adoptText(&target,&local_38);
    Orphan<capnp::Text>::~Orphan(&local_38);
    break;
  case DATA:
    local_68.builder.capTable = (CapTableBuilder *)0x0;
    local_68.builder.location = (word *)0x0;
    local_68.builder.tag.content = 0;
    local_68.builder.segment = (SegmentBuilder *)0x0;
    Orphan<capnp::Data>::Orphan(&local_68);
    capnp::schema::Value::Builder::adoptData(&target,&local_68);
    Orphan<capnp::Data>::~Orphan(&local_68);
    break;
  case LIST:
    capnp::schema::Value::Builder::initList(&local_98,&target);
    break;
  case ENUM:
    capnp::schema::Value::Builder::setEnum(&target,0);
    break;
  case STRUCT:
    capnp::schema::Value::Builder::initStruct(&local_80,&target);
    break;
  case INTERFACE:
    capnp::schema::Value::Builder::setInterface(&target);
    break;
  case ANY_POINTER:
    capnp::schema::Value::Builder::initAnyPointer(&local_b0,&target);
  }
  return;
}

Assistant:

void NodeTranslator::compileDefaultDefaultValue(
    schema::Type::Reader type, schema::Value::Builder target) {
  switch (type.which()) {
    case schema::Type::VOID: target.setVoid(); break;
    case schema::Type::BOOL: target.setBool(false); break;
    case schema::Type::INT8: target.setInt8(0); break;
    case schema::Type::INT16: target.setInt16(0); break;
    case schema::Type::INT32: target.setInt32(0); break;
    case schema::Type::INT64: target.setInt64(0); break;
    case schema::Type::UINT8: target.setUint8(0); break;
    case schema::Type::UINT16: target.setUint16(0); break;
    case schema::Type::UINT32: target.setUint32(0); break;
    case schema::Type::UINT64: target.setUint64(0); break;
    case schema::Type::FLOAT32: target.setFloat32(0); break;
    case schema::Type::FLOAT64: target.setFloat64(0); break;
    case schema::Type::ENUM: target.setEnum(0); break;
    case schema::Type::INTERFACE: target.setInterface(); break;

    // Bit of a hack:  For Text/Data, we adopt a null orphan, which sets the field to null.
    // TODO(cleanup):  Create a cleaner way to do this.
    case schema::Type::TEXT: target.adoptText(Orphan<Text>()); break;
    case schema::Type::DATA: target.adoptData(Orphan<Data>()); break;
    case schema::Type::STRUCT: target.initStruct(); break;
    case schema::Type::LIST: target.initList(); break;
    case schema::Type::ANY_POINTER: target.initAnyPointer(); break;
  }
}